

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_adaptive_quantize_sse2.c
# Opt level: O1

void aom_highbd_quantize_b_64x64_adaptive_sse2
               (tran_low_t *coeff_ptr,intptr_t n_coeffs,int16_t *zbin_ptr,int16_t *round_ptr,
               int16_t *quant_ptr,int16_t *quant_shift_ptr,tran_low_t *qcoeff_ptr,
               tran_low_t *dqcoeff_ptr,int16_t *dequant_ptr,uint16_t *eob_ptr,int16_t *scan,
               int16_t *iscan)

{
  uint *puVar1;
  int *piVar2;
  uint *puVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  bool bVar26;
  bool bVar27;
  ulong uVar28;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  ulong uVar33;
  undefined1 auVar34 [12];
  undefined1 auVar35 [12];
  undefined1 auVar36 [12];
  undefined1 auVar37 [12];
  undefined1 auVar38 [12];
  ulong uVar39;
  uint16_t uVar40;
  short *psVar41;
  ulong uVar42;
  undefined4 in_R11D;
  long lVar43;
  bool bVar44;
  ushort uVar45;
  int iVar46;
  ushort uVar48;
  ushort uVar49;
  int iVar50;
  ushort uVar51;
  ushort uVar52;
  ushort uVar53;
  ushort uVar54;
  undefined1 auVar47 [16];
  ushort uVar55;
  ushort uVar56;
  ushort uVar71;
  ushort uVar72;
  ushort uVar73;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  int iVar76;
  undefined1 auVar74 [16];
  int iVar77;
  undefined1 auVar75 [16];
  uint uVar78;
  uint uVar85;
  uint uVar86;
  undefined1 auVar79 [16];
  uint uVar87;
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  int iVar102;
  int iVar108;
  int iVar109;
  int iVar110;
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  uint uVar111;
  uint uVar125;
  uint uVar126;
  uint uVar127;
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  uint uVar134;
  uint uVar135;
  undefined1 auVar131 [16];
  uint uVar136;
  uint uVar137;
  uint uVar142;
  uint uVar143;
  uint uVar144;
  uint uVar145;
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  uint uVar146;
  undefined1 auVar147 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  int iVar155;
  int iVar158;
  int iVar159;
  int iVar160;
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  uint uVar161;
  uint uVar166;
  uint uVar167;
  undefined1 auVar162 [16];
  uint uVar168;
  uint uVar169;
  undefined1 auVar165 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 local_148 [16];
  undefined8 local_110 [30];
  __m128i sign_hi_4;
  __m128i sign_lo_4;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  
  auVar47 = pshuflw(ZEXT416(*(uint *)zbin_ptr),ZEXT416(*(uint *)zbin_ptr),0x60);
  iVar46 = (auVar47._0_4_ >> 0x10) + 2 >> 2;
  iVar50 = (auVar47._4_4_ >> 0x10) + 2 >> 2;
  local_110[0] = CONCAT44(iVar50,iVar46);
  auVar47 = pshuflw(ZEXT416(*(uint *)dequant_ptr),ZEXT416(*(uint *)dequant_ptr),0xd4);
  auVar57 = pmaddwd(auVar47,_DAT_0050e5a0);
  auVar88._8_4_ = 0xffffffff;
  auVar88._0_8_ = 0xffffffffffffffff;
  auVar88._12_4_ = 0xffffffff;
  iVar50 = iVar50 * 0x20 + -1 + (auVar57._4_4_ + 0x40 >> 7);
  auVar47 = *(undefined1 (*) [16])zbin_ptr;
  auVar75 = *(undefined1 (*) [16])round_ptr;
  auVar176 = *(undefined1 (*) [16])quant_ptr;
  auVar62 = *(undefined1 (*) [16])dequant_ptr;
  auVar89 = *(undefined1 (*) [16])quant_shift_ptr;
  auVar74 = psraw(auVar47,0xf);
  auVar79 = psraw(auVar75,0xf);
  auVar128._0_12_ = auVar47._0_12_;
  auVar128._12_2_ = auVar47._6_2_;
  auVar128._14_2_ = auVar74._6_2_;
  auVar170._12_4_ = auVar128._12_4_;
  auVar170._0_10_ = auVar47._0_10_;
  auVar170._10_2_ = auVar74._4_2_;
  auVar175._10_6_ = auVar170._10_6_;
  auVar175._0_8_ = auVar47._0_8_;
  auVar175._8_2_ = auVar47._4_2_;
  auVar34._4_8_ = auVar175._8_8_;
  auVar34._2_2_ = auVar74._2_2_;
  auVar34._0_2_ = auVar47._2_2_;
  auVar164._0_12_ = auVar75._0_12_;
  auVar164._12_2_ = auVar75._6_2_;
  auVar164._14_2_ = auVar79._6_2_;
  auVar163._12_4_ = auVar164._12_4_;
  auVar163._0_10_ = auVar75._0_10_;
  auVar163._10_2_ = auVar79._4_2_;
  auVar162._10_6_ = auVar163._10_6_;
  auVar162._0_8_ = auVar75._0_8_;
  auVar162._8_2_ = auVar75._4_2_;
  auVar35._4_8_ = auVar162._8_8_;
  auVar35._2_2_ = auVar79._2_2_;
  auVar35._0_2_ = auVar75._2_2_;
  uVar143 = auVar175._8_4_ + 2U >> 2;
  uVar145 = auVar170._12_4_ + 2U >> 2;
  iVar76 = uVar143 - 1;
  iVar77 = uVar145 - 1;
  uVar111 = *coeff_ptr >> 0x1f;
  uVar125 = coeff_ptr[1] >> 0x1f;
  uVar126 = coeff_ptr[2] >> 0x1f;
  uVar127 = coeff_ptr[3] >> 0x1f;
  uVar78 = coeff_ptr[4] >> 0x1f;
  uVar85 = coeff_ptr[5] >> 0x1f;
  uVar86 = coeff_ptr[6] >> 0x1f;
  uVar87 = coeff_ptr[7] >> 0x1f;
  iVar155 = (*coeff_ptr ^ uVar111) - uVar111;
  iVar158 = (coeff_ptr[1] ^ uVar125) - uVar125;
  iVar159 = (coeff_ptr[2] ^ uVar126) - uVar126;
  iVar160 = (coeff_ptr[3] ^ uVar127) - uVar127;
  iVar102 = (coeff_ptr[4] ^ uVar78) - uVar78;
  iVar108 = (coeff_ptr[5] ^ uVar85) - uVar85;
  iVar109 = (coeff_ptr[6] ^ uVar86) - uVar86;
  iVar110 = (coeff_ptr[7] ^ uVar87) - uVar87;
  auVar57._0_4_ = -(uint)(iVar46 * 0x20 + -1 + (auVar57._0_4_ + 0x40 >> 7) < iVar155 * 0x20);
  auVar57._4_4_ = -(uint)(iVar50 < iVar158 * 0x20);
  auVar57._8_4_ = -(uint)(iVar50 < iVar159 * 0x20);
  auVar57._12_4_ = -(uint)(iVar50 < iVar160 * 0x20);
  auVar112._0_4_ = -(uint)(iVar50 < iVar102 * 0x20);
  auVar112._4_4_ = -(uint)(iVar50 < iVar108 * 0x20);
  auVar112._8_4_ = -(uint)(iVar50 < iVar109 * 0x20);
  auVar112._12_4_ = -(uint)(iVar50 < iVar110 * 0x20);
  auVar112 = packssdw(auVar57,auVar112);
  auVar57 = (undefined1  [16])0x0;
  local_148 = (undefined1  [16])0x0;
  bVar25 = (auVar112 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar26 = (auVar112 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar24 = (auVar112 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar23 = (auVar112 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar22 = (auVar112 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar21 = (auVar112 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar20 = (auVar112 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar19 = (auVar112 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar18 = (auVar112 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar17 = (auVar112 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar16 = (auVar112 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar15 = (auVar112 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar14 = (auVar112 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar13 = (auVar112 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar12 = (auVar112 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar44 = auVar112[0xf] < '\0';
  if (((((((((((((((bVar25 || bVar26) || bVar24) || bVar23) || bVar22) || bVar21) || bVar20) ||
             bVar19) || bVar18) || bVar17) || bVar16) || bVar15) || bVar14) || bVar13) || bVar12) ||
      bVar44) {
    local_148 = auVar112 & *(undefined1 (*) [16])iscan;
  }
  bVar44 = ((((((((((((((bVar25 || bVar26) || bVar24) || bVar23) || bVar22) || bVar21) || bVar20) ||
                  bVar19) || bVar18) || bVar17) || bVar16) || bVar15) || bVar14) || bVar13) ||
           bVar12) || bVar44;
  auVar175 = psraw(auVar176,0xf);
  auVar128 = psraw(auVar62,0xf);
  auVar112 = psraw(auVar89,0xf);
  auVar47._0_4_ = -(uint)(iVar155 < (int)(CONCAT22(auVar74._0_2_,auVar47._0_2_) + 2U >> 2));
  auVar47._4_4_ = -(uint)(iVar158 < (int)(auVar34._0_4_ + 2U >> 2));
  auVar47._8_4_ = -(uint)(iVar159 < (int)uVar143);
  auVar47._12_4_ = -(uint)(iVar160 < (int)uVar145);
  auVar74._0_4_ = -(uint)(iVar76 < iVar102);
  auVar74._4_4_ = -(uint)(iVar77 < iVar108);
  auVar74._8_4_ = -(uint)(iVar76 < iVar109);
  auVar74._12_4_ = -(uint)(iVar77 < iVar110);
  auVar170 = packssdw(auVar88 ^ auVar47,auVar74);
  bVar26 = (auVar170 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar27 = (auVar170 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar25 = (auVar170 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar24 = (auVar170 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar23 = (auVar170 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar22 = (auVar170 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar21 = (auVar170 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar20 = (auVar170 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar19 = (auVar170 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar18 = (auVar170 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar17 = (auVar170 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar16 = (auVar170 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar15 = (auVar170 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar14 = (auVar170 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar13 = (auVar170 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar12 = auVar170[0xf] < '\0';
  if (((((((((((((((bVar26 || bVar27) || bVar25) || bVar24) || bVar23) || bVar22) || bVar21) ||
             bVar20) || bVar19) || bVar18) || bVar17) || bVar16) || bVar15) || bVar14) || bVar13) ||
      bVar12) {
    auVar57 = auVar170 & *(undefined1 (*) [16])iscan;
  }
  bVar12 = ((((((((((((((bVar26 || bVar27) || bVar25) || bVar24) || bVar23) || bVar22) || bVar21) ||
                  bVar20) || bVar19) || bVar18) || bVar17) || bVar16) || bVar15) || bVar14) ||
           bVar13) || bVar12;
  auVar60._0_12_ = auVar176._0_12_;
  auVar60._12_2_ = auVar176._6_2_;
  auVar60._14_2_ = auVar175._6_2_;
  auVar59._12_4_ = auVar60._12_4_;
  auVar59._0_10_ = auVar176._0_10_;
  auVar59._10_2_ = auVar175._4_2_;
  auVar58._10_6_ = auVar59._10_6_;
  auVar58._0_8_ = auVar176._0_8_;
  auVar58._8_2_ = auVar176._4_2_;
  auVar36._4_8_ = auVar58._8_8_;
  auVar36._2_2_ = auVar175._2_2_;
  auVar36._0_2_ = auVar176._2_2_;
  auVar176._2_2_ = auVar175._0_2_;
  auVar176._4_12_ = auVar36;
  auVar133._0_12_ = auVar62._0_12_;
  auVar133._12_2_ = auVar62._6_2_;
  auVar133._14_2_ = auVar128._6_2_;
  auVar132._12_4_ = auVar133._12_4_;
  auVar132._0_10_ = auVar62._0_10_;
  auVar132._10_2_ = auVar128._4_2_;
  auVar131._10_6_ = auVar132._10_6_;
  auVar131._0_8_ = auVar62._0_8_;
  auVar131._8_2_ = auVar62._4_2_;
  auVar37._4_8_ = auVar131._8_8_;
  auVar37._2_2_ = auVar128._2_2_;
  auVar37._0_2_ = auVar62._2_2_;
  auVar117._0_2_ = auVar62._0_2_;
  auVar117._2_2_ = auVar128._0_2_;
  auVar117._4_12_ = auVar37;
  auVar149._0_12_ = auVar89._0_12_;
  auVar149._12_2_ = auVar89._6_2_;
  auVar149._14_2_ = auVar112._6_2_;
  auVar148._12_4_ = auVar149._12_4_;
  auVar148._0_10_ = auVar89._0_10_;
  auVar148._10_2_ = auVar112._4_2_;
  auVar147._10_6_ = auVar148._10_6_;
  auVar147._0_8_ = auVar89._0_8_;
  auVar147._8_2_ = auVar89._4_2_;
  auVar38._4_8_ = auVar147._8_8_;
  auVar38._2_2_ = auVar112._2_2_;
  auVar38._0_2_ = auVar89._2_2_;
  auVar172._0_2_ = auVar89._0_2_;
  auVar172._2_2_ = auVar112._0_2_;
  auVar172._4_12_ = auVar38;
  uVar167 = auVar162._8_4_ + 2U >> 2;
  uVar168 = auVar163._12_4_ + 2U >> 2;
  iVar46 = movmskps(in_R11D,auVar88 ^ auVar47 | auVar74);
  uVar143 = auVar58._8_4_;
  uVar134 = auVar147._8_4_;
  uVar145 = auVar131._8_4_;
  auVar89._8_4_ = (int)uVar143 >> 0x1f;
  auVar89._12_4_ = (int)auVar59._12_4_ >> 0x1f;
  auVar91._8_4_ = (int)uVar134 >> 0x1f;
  auVar91._12_4_ = (int)auVar148._12_4_ >> 0x1f;
  auVar62._8_4_ = (int)uVar145 >> 0x1f;
  auVar62._12_4_ = (int)auVar132._12_4_ >> 0x1f;
  if (iVar46 == 0) {
    *(undefined1 (*) [16])(qcoeff_ptr + 4) = (undefined1  [16])0x0;
    qcoeff_ptr[0] = 0;
    qcoeff_ptr[1] = 0;
    qcoeff_ptr[2] = 0;
    qcoeff_ptr[3] = 0;
    *(undefined1 (*) [16])(dqcoeff_ptr + 4) = (undefined1  [16])0x0;
    dqcoeff_ptr[0] = 0;
    dqcoeff_ptr[1] = 0;
    dqcoeff_ptr[2] = 0;
    dqcoeff_ptr[3] = 0;
  }
  else {
    auVar156._0_4_ = iVar155 + (CONCAT22(auVar79._0_2_,auVar75._0_2_) + 2U >> 2);
    auVar156._4_4_ = iVar158 + (auVar35._0_4_ + 2U >> 2);
    auVar156._8_4_ = iVar159 + uVar167;
    auVar156._12_4_ = iVar160 + uVar168;
    auVar89._0_4_ = (int)auVar175._0_2_ >> 0xf;
    auVar89._4_4_ = auVar36._0_4_ >> 0x1f;
    auVar113._0_8_ = CONCAT44(auVar89._0_4_,auVar89._0_4_);
    auVar113._8_4_ = auVar89._4_4_;
    auVar113._12_4_ = auVar89._4_4_;
    auVar171._0_8_ = CONCAT44(auVar89._8_4_,auVar89._8_4_);
    auVar171._8_4_ = auVar89._12_4_;
    auVar171._12_4_ = auVar89._12_4_;
    auVar176 = auVar176 ^ auVar89;
    auVar177._0_4_ = auVar176._0_4_ - auVar89._0_4_;
    auVar177._4_4_ = auVar176._4_4_ - auVar89._4_4_;
    auVar177._8_4_ = auVar176._8_4_ - auVar89._8_4_;
    auVar177._12_4_ = auVar176._12_4_ - auVar89._12_4_;
    auVar90._0_8_ = (ulong)auVar156._0_4_ * (ulong)auVar177._0_4_;
    auVar90._8_8_ = (auVar156._8_8_ & 0xffffffff) * (ulong)auVar177._8_4_;
    auVar178._0_8_ = (ulong)auVar177._4_4_ * (ulong)auVar156._4_4_;
    auVar178._8_8_ = (auVar177._8_8_ >> 0x20) * (auVar156._8_8_ >> 0x20);
    auVar80._0_4_ =
         (int)((ulong)(SUB168(auVar90 ^ auVar113,0) - auVar113._0_8_) >> 0x10) + auVar156._0_4_;
    auVar80._4_4_ =
         (int)((ulong)(SUB168(auVar178 ^ auVar171,0) - auVar171._0_8_) >> 0x10) + auVar156._4_4_;
    auVar80._8_4_ =
         (int)((ulong)(SUB168(auVar90 ^ auVar113,8) - auVar113._8_8_) >> 0x10) + auVar156._8_4_;
    auVar80._12_4_ =
         (int)((ulong)(SUB168(auVar178 ^ auVar171,8) - auVar171._8_8_) >> 0x10) + auVar156._12_4_;
    auVar91._0_4_ = (int)auVar112._0_2_ >> 0xf;
    auVar91._4_4_ = auVar38._0_4_ >> 0x1f;
    auVar114._0_8_ = CONCAT44(auVar91._0_4_,auVar91._0_4_);
    auVar114._8_4_ = auVar91._4_4_;
    auVar114._12_4_ = auVar91._4_4_;
    auVar157._0_8_ = CONCAT44(auVar91._8_4_,auVar91._8_4_);
    auVar157._8_4_ = auVar91._12_4_;
    auVar157._12_4_ = auVar91._12_4_;
    auVar172 = auVar172 ^ auVar91;
    auVar173._0_4_ = auVar172._0_4_ - auVar91._0_4_;
    auVar173._4_4_ = auVar172._4_4_ - auVar91._4_4_;
    auVar173._8_4_ = auVar172._8_4_ - auVar91._8_4_;
    auVar173._12_4_ = auVar172._12_4_ - auVar91._12_4_;
    auVar92._0_8_ = (ulong)auVar80._0_4_ * (ulong)auVar173._0_4_;
    auVar92._8_8_ = (auVar80._8_8_ & 0xffffffff) * (ulong)auVar173._8_4_;
    auVar174._0_8_ = (ulong)auVar173._4_4_ * (ulong)auVar80._4_4_;
    auVar174._8_8_ = (auVar173._8_8_ >> 0x20) * (auVar80._8_8_ >> 0x20);
    auVar103._0_4_ = iVar102 + uVar167;
    auVar103._4_4_ = iVar108 + uVar168;
    auVar103._8_4_ = iVar109 + uVar167;
    auVar103._12_4_ = iVar110 + uVar168;
    auVar93._0_8_ = CONCAT44(auVar89._8_4_,auVar89._8_4_);
    auVar93._8_4_ = auVar89._12_4_;
    auVar93._12_4_ = auVar89._12_4_;
    auVar115._0_8_ = CONCAT44(auVar89._8_4_,auVar89._8_4_);
    auVar115._8_4_ = auVar89._12_4_;
    auVar115._12_4_ = auVar89._12_4_;
    auVar150._0_4_ = (uVar143 ^ auVar89._8_4_) - auVar89._8_4_;
    auVar150._4_4_ = (auVar59._12_4_ ^ auVar89._12_4_) - auVar89._12_4_;
    auVar150._8_4_ = (uVar143 ^ auVar89._8_4_) - auVar89._8_4_;
    auVar150._12_4_ = (auVar59._12_4_ ^ auVar89._12_4_) - auVar89._12_4_;
    auVar75._0_8_ = (ulong)auVar103._0_4_ * (ulong)auVar150._0_4_;
    auVar75._8_8_ = (auVar103._8_8_ & 0xffffffff) * (ulong)auVar150._8_4_;
    auVar151._0_8_ = (ulong)auVar150._4_4_ * (ulong)auVar103._4_4_;
    auVar151._8_8_ = (auVar150._8_8_ >> 0x20) * (auVar103._8_8_ >> 0x20);
    auVar79._0_4_ =
         (int)((ulong)(SUB168(auVar75 ^ auVar93,0) - auVar93._0_8_) >> 0x10) + auVar103._0_4_;
    auVar79._4_4_ =
         (int)((ulong)(SUB168(auVar151 ^ auVar115,0) - auVar115._0_8_) >> 0x10) + auVar103._4_4_;
    auVar79._8_4_ =
         (int)((ulong)(SUB168(auVar75 ^ auVar93,8) - auVar93._8_8_) >> 0x10) + auVar103._8_4_;
    auVar79._12_4_ =
         (int)((ulong)(SUB168(auVar151 ^ auVar115,8) - auVar115._8_8_) >> 0x10) + auVar103._12_4_;
    auVar104._0_8_ = CONCAT44(auVar91._8_4_,auVar91._8_4_);
    auVar104._8_4_ = auVar91._12_4_;
    auVar104._12_4_ = auVar91._12_4_;
    auVar116._0_8_ = CONCAT44(auVar91._8_4_,auVar91._8_4_);
    auVar116._8_4_ = auVar91._12_4_;
    auVar116._12_4_ = auVar91._12_4_;
    auVar152._0_4_ = (uVar134 ^ auVar91._8_4_) - auVar91._8_4_;
    auVar152._4_4_ = (auVar148._12_4_ ^ auVar91._12_4_) - auVar91._12_4_;
    auVar152._8_4_ = (uVar134 ^ auVar91._8_4_) - auVar91._8_4_;
    auVar152._12_4_ = (auVar148._12_4_ ^ auVar91._12_4_) - auVar91._12_4_;
    auVar94._0_8_ = (ulong)auVar79._0_4_ * (ulong)auVar152._0_4_;
    auVar94._8_8_ = (auVar79._8_8_ & 0xffffffff) * (ulong)auVar152._8_4_;
    auVar153._0_8_ = (ulong)auVar152._4_4_ * (ulong)auVar79._4_4_;
    auVar153._8_8_ = (auVar152._8_8_ >> 0x20) * (auVar79._8_8_ >> 0x20);
    auVar138._0_4_ =
         ((uint)((ulong)(SUB168(auVar92 ^ auVar114,0) - auVar114._0_8_) >> 0xe) ^ uVar111) - uVar111
    ;
    auVar138._4_4_ =
         ((uint)((ulong)((SUB168(auVar174 ^ auVar157,0) - auVar157._0_8_) * 0x40000) >> 0x20) ^
         uVar125) - uVar125;
    auVar138._8_4_ =
         ((uint)((ulong)(SUB168(auVar92 ^ auVar114,8) - auVar114._8_8_) >> 0xe) ^ uVar126) - uVar126
    ;
    auVar138._12_4_ =
         ((uint)((ulong)((SUB168(auVar174 ^ auVar157,8) - auVar157._8_8_) * 0x40000) >> 0x20) ^
         uVar127) - uVar127;
    auVar61._0_4_ =
         ((uint)((ulong)(SUB168(auVar94 ^ auVar104,0) - auVar104._0_8_) >> 0xe) ^ uVar78) - uVar78;
    auVar61._4_4_ =
         ((uint)((ulong)((SUB168(auVar153 ^ auVar116,0) - auVar116._0_8_) * 0x40000) >> 0x20) ^
         uVar85) - uVar85;
    auVar61._8_4_ =
         ((uint)((ulong)(SUB168(auVar94 ^ auVar104,8) - auVar104._8_8_) >> 0xe) ^ uVar86) - uVar86;
    auVar61._12_4_ =
         ((uint)((ulong)((SUB168(auVar153 ^ auVar116,8) - auVar116._8_8_) * 0x40000) >> 0x20) ^
         uVar87) - uVar87;
    auVar138 = ~auVar47 & auVar138;
    auVar74 = auVar74 & auVar61;
    *(undefined1 (*) [16])qcoeff_ptr = auVar138;
    *(undefined1 (*) [16])(qcoeff_ptr + 4) = auVar74;
    auVar81._0_4_ = auVar138._0_4_ >> 0x1f;
    auVar81._4_4_ = auVar138._4_4_ >> 0x1f;
    auVar81._8_4_ = auVar138._8_4_ >> 0x1f;
    auVar81._12_4_ = auVar138._12_4_ >> 0x1f;
    auVar138 = auVar138 ^ auVar81;
    auVar139._0_4_ = auVar138._0_4_ - auVar81._0_4_;
    auVar139._4_4_ = auVar138._4_4_ - auVar81._4_4_;
    auVar139._8_4_ = auVar138._8_4_ - auVar81._8_4_;
    auVar139._12_4_ = auVar138._12_4_ - auVar81._12_4_;
    auVar62._0_4_ = (int)auVar128._0_2_ >> 0xf;
    auVar62._4_4_ = auVar37._0_4_ >> 0x1f;
    auVar95._0_8_ = CONCAT44(auVar62._0_4_,auVar62._0_4_);
    auVar95._8_4_ = auVar62._4_4_;
    auVar95._12_4_ = auVar62._4_4_;
    auVar105._0_8_ = CONCAT44(auVar62._8_4_,auVar62._8_4_);
    auVar105._8_4_ = auVar62._12_4_;
    auVar105._12_4_ = auVar62._12_4_;
    auVar117 = auVar117 ^ auVar62;
    auVar118._0_4_ = auVar117._0_4_ - auVar62._0_4_;
    auVar118._4_4_ = auVar117._4_4_ - auVar62._4_4_;
    auVar118._8_4_ = auVar117._8_4_ - auVar62._8_4_;
    auVar118._12_4_ = auVar117._12_4_ - auVar62._12_4_;
    auVar63._0_8_ = (ulong)auVar139._0_4_ * (ulong)auVar118._0_4_;
    auVar63._8_8_ = (auVar139._8_8_ & 0xffffffff) * (ulong)auVar118._8_4_;
    auVar119._0_8_ = (ulong)auVar118._4_4_ * (ulong)auVar139._4_4_;
    auVar119._8_8_ = (auVar118._8_8_ >> 0x20) * (auVar139._8_8_ >> 0x20);
    auVar65._0_4_ = (undefined4)((ulong)(SUB168(auVar63 ^ auVar95,0) - auVar95._0_8_) >> 2);
    auVar64._8_4_ = (undefined4)((ulong)(SUB168(auVar63 ^ auVar95,8) - auVar95._8_8_) >> 2);
    auVar64._4_4_ = auVar64._8_4_;
    auVar64._0_4_ = auVar65._0_4_;
    auVar64._12_4_ =
         (int)((ulong)((SUB168(auVar119 ^ auVar105,8) - auVar105._8_8_) * 0x40000000) >> 0x20);
    auVar65._8_8_ = auVar64._8_8_;
    auVar65._4_4_ =
         (int)((ulong)((SUB168(auVar119 ^ auVar105,0) - auVar105._0_8_) * 0x40000000) >> 0x20);
    auVar65 = auVar65 ^ auVar81;
    auVar82._0_4_ = auVar74._0_4_ >> 0x1f;
    auVar82._4_4_ = auVar74._4_4_ >> 0x1f;
    auVar82._8_4_ = auVar74._8_4_ >> 0x1f;
    auVar82._12_4_ = auVar74._12_4_ >> 0x1f;
    auVar74 = auVar74 ^ auVar82;
    auVar154._0_4_ = auVar74._0_4_ - auVar82._0_4_;
    auVar154._4_4_ = auVar74._4_4_ - auVar82._4_4_;
    auVar154._8_4_ = auVar74._8_4_ - auVar82._8_4_;
    auVar154._12_4_ = auVar74._12_4_ - auVar82._12_4_;
    auVar106._0_8_ = CONCAT44(auVar62._8_4_,auVar62._8_4_);
    auVar106._8_4_ = auVar62._12_4_;
    auVar106._12_4_ = auVar62._12_4_;
    auVar120._0_8_ = CONCAT44(auVar62._8_4_,auVar62._8_4_);
    auVar120._8_4_ = auVar62._12_4_;
    auVar120._12_4_ = auVar62._12_4_;
    auVar140._0_4_ = (uVar145 ^ auVar62._8_4_) - auVar62._8_4_;
    auVar140._4_4_ = (auVar132._12_4_ ^ auVar62._12_4_) - auVar62._12_4_;
    auVar140._8_4_ = (uVar145 ^ auVar62._8_4_) - auVar62._8_4_;
    auVar140._12_4_ = (auVar132._12_4_ ^ auVar62._12_4_) - auVar62._12_4_;
    auVar96._0_8_ = (ulong)auVar154._0_4_ * (ulong)auVar140._0_4_;
    auVar96._8_8_ = (auVar154._8_8_ & 0xffffffff) * (ulong)auVar140._8_4_;
    auVar141._0_8_ = (ulong)auVar140._4_4_ * (ulong)auVar154._4_4_;
    auVar141._8_8_ = (auVar140._8_8_ >> 0x20) * (auVar154._8_8_ >> 0x20);
    auVar98._0_4_ = (undefined4)((ulong)(SUB168(auVar96 ^ auVar106,0) - auVar106._0_8_) >> 2);
    auVar97._8_4_ = (undefined4)((ulong)(SUB168(auVar96 ^ auVar106,8) - auVar106._8_8_) >> 2);
    auVar97._4_4_ = auVar97._8_4_;
    auVar97._0_4_ = auVar98._0_4_;
    auVar97._12_4_ =
         (int)((ulong)((SUB168(auVar141 ^ auVar120,8) - auVar120._8_8_) * 0x40000000) >> 0x20);
    auVar98._8_8_ = auVar97._8_8_;
    auVar98._4_4_ =
         (int)((ulong)((SUB168(auVar141 ^ auVar120,0) - auVar120._0_8_) * 0x40000000) >> 0x20);
    auVar98 = auVar98 ^ auVar82;
    *dqcoeff_ptr = auVar65._0_4_ - auVar81._0_4_;
    dqcoeff_ptr[1] = auVar65._4_4_ - auVar81._4_4_;
    dqcoeff_ptr[2] = auVar65._8_4_ - auVar81._8_4_;
    dqcoeff_ptr[3] = auVar65._12_4_ - auVar81._12_4_;
    dqcoeff_ptr[4] = auVar98._0_4_ - auVar82._0_4_;
    dqcoeff_ptr[5] = auVar98._4_4_ - auVar82._4_4_;
    dqcoeff_ptr[6] = auVar98._8_4_ - auVar82._8_4_;
    dqcoeff_ptr[7] = auVar98._12_4_ - auVar82._12_4_;
  }
  local_148._2_2_ = (ushort)(-1 < (short)local_148._2_2_) * local_148._2_2_;
  local_148._0_2_ = (ushort)(-1 < (short)local_148._0_2_) * local_148._0_2_;
  local_148._4_2_ = (ushort)(-1 < (short)local_148._4_2_) * local_148._4_2_;
  local_148._6_2_ = (ushort)(-1 < (short)local_148._6_2_) * local_148._6_2_;
  local_148._8_2_ = (ushort)(-1 < (short)local_148._8_2_) * local_148._8_2_;
  local_148._10_2_ = (ushort)(-1 < (short)local_148._10_2_) * local_148._10_2_;
  local_148._12_2_ = (ushort)(-1 < (short)local_148._12_2_) * local_148._12_2_;
  local_148._14_2_ = (ushort)(-1 < (short)local_148._14_2_) * local_148._14_2_;
  uVar45 = (ushort)(-1 < auVar57._0_2_) * auVar57._0_2_;
  uVar48 = (ushort)(-1 < auVar57._2_2_) * auVar57._2_2_;
  uVar49 = (ushort)(-1 < auVar57._4_2_) * auVar57._4_2_;
  uVar51 = (ushort)(-1 < auVar57._6_2_) * auVar57._6_2_;
  uVar52 = (ushort)(-1 < auVar57._8_2_) * auVar57._8_2_;
  uVar53 = (ushort)(-1 < auVar57._10_2_) * auVar57._10_2_;
  uVar54 = (ushort)(-1 < auVar57._12_2_) * auVar57._12_2_;
  uVar55 = (ushort)(-1 < auVar57._14_2_) * auVar57._14_2_;
  if (8 < n_coeffs) {
    uVar161 = (uVar143 ^ auVar89._8_4_) - auVar89._8_4_;
    uVar166 = (auVar59._12_4_ ^ auVar89._12_4_) - auVar89._12_4_;
    uVar143 = (uVar143 ^ auVar89._8_4_) - auVar89._8_4_;
    uVar169 = (auVar59._12_4_ ^ auVar89._12_4_) - auVar89._12_4_;
    uVar111 = (uVar134 ^ auVar91._8_4_) - auVar91._8_4_;
    uVar125 = (auVar148._12_4_ ^ auVar91._12_4_) - auVar91._12_4_;
    uVar126 = (uVar134 ^ auVar91._8_4_) - auVar91._8_4_;
    uVar127 = (auVar148._12_4_ ^ auVar91._12_4_) - auVar91._12_4_;
    uVar78 = (uVar145 ^ auVar62._8_4_) - auVar62._8_4_;
    uVar85 = (auVar132._12_4_ ^ auVar62._12_4_) - auVar62._12_4_;
    uVar86 = (uVar145 ^ auVar62._8_4_) - auVar62._8_4_;
    uVar87 = (auVar132._12_4_ ^ auVar62._12_4_) - auVar62._12_4_;
    lVar43 = 8;
    uVar39 = CONCAT44(auVar89._8_4_,auVar89._8_4_);
    uVar42 = CONCAT44(auVar89._12_4_,auVar89._12_4_);
    do {
      puVar1 = (uint *)(coeff_ptr + lVar43);
      puVar3 = (uint *)(coeff_ptr + lVar43 + 4);
      uVar137 = (int)*puVar1 >> 0x1f;
      uVar142 = (int)puVar1[1] >> 0x1f;
      uVar144 = (int)puVar1[2] >> 0x1f;
      uVar146 = (int)puVar1[3] >> 0x1f;
      uVar145 = (int)*puVar3 >> 0x1f;
      uVar134 = (int)puVar3[1] >> 0x1f;
      uVar135 = (int)puVar3[2] >> 0x1f;
      uVar136 = (int)puVar3[3] >> 0x1f;
      iVar46 = (*puVar1 ^ uVar137) - uVar137;
      iVar102 = (puVar1[1] ^ uVar142) - uVar142;
      iVar108 = (puVar1[2] ^ uVar144) - uVar144;
      iVar109 = (puVar1[3] ^ uVar146) - uVar146;
      iVar110 = (*puVar3 ^ uVar145) - uVar145;
      iVar155 = (puVar3[1] ^ uVar134) - uVar134;
      iVar158 = (puVar3[2] ^ uVar135) - uVar135;
      iVar159 = (puVar3[3] ^ uVar136) - uVar136;
      auVar66._0_4_ = -(uint)(iVar50 < iVar46 * 0x20);
      auVar66._4_4_ = -(uint)(iVar50 < iVar102 * 0x20);
      auVar66._8_4_ = -(uint)(iVar50 < iVar108 * 0x20);
      auVar66._12_4_ = -(uint)(iVar50 < iVar109 * 0x20);
      auVar107._0_4_ = -(uint)(iVar50 < iVar110 * 0x20);
      auVar107._4_4_ = -(uint)(iVar50 < iVar155 * 0x20);
      auVar107._8_4_ = -(uint)(iVar50 < iVar158 * 0x20);
      auVar107._12_4_ = -(uint)(iVar50 < iVar159 * 0x20);
      auVar47 = packssdw(auVar66,auVar107);
      auVar75 = (undefined1  [16])0x0;
      if ((((((((((((((((auVar47 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                       (auVar47 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar47 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar47 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar47 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar47 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar47 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar47 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar47 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar47 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar47 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar47 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar47 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (auVar47 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar47 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar47[0xf] < '\0'
         ) {
        auVar75 = auVar47 & *(undefined1 (*) [16])(iscan + lVar43);
        bVar44 = true;
      }
      auVar121._0_4_ = -(uint)(iVar76 < iVar46);
      auVar121._4_4_ = -(uint)(iVar77 < iVar102);
      auVar121._8_4_ = -(uint)(iVar76 < iVar108);
      auVar121._12_4_ = -(uint)(iVar77 < iVar109);
      auVar83._0_4_ = -(uint)(iVar76 < iVar110);
      auVar83._4_4_ = -(uint)(iVar77 < iVar155);
      auVar83._8_4_ = -(uint)(iVar76 < iVar158);
      auVar83._12_4_ = -(uint)(iVar77 < iVar159);
      auVar47 = packssdw(auVar121,auVar83);
      uVar56 = (ushort)(SUB161(auVar47 >> 7,0) & 1) | (ushort)(SUB161(auVar47 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar47 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar47 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar47 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar47 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar47 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar47 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar47 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar47 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar47 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar47 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar47 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar47 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar47 >> 0x77,0) & 1) << 0xe |
               (ushort)(byte)(auVar47[0xf] >> 7) << 0xf;
      if (uVar56 == 0) {
        auVar47 = (undefined1  [16])0x0;
      }
      else {
        auVar47 = auVar47 & *(undefined1 (*) [16])(iscan + lVar43);
        bVar12 = true;
      }
      iVar160 = movmskps((uint)uVar56,auVar83 | auVar121);
      if (iVar160 == 0) {
        *(undefined1 (*) [16])(qcoeff_ptr + lVar43 + 4) = (undefined1  [16])0x0;
        *(undefined1 (*) [16])(qcoeff_ptr + lVar43) = (undefined1  [16])0x0;
        *(undefined1 (*) [16])(dqcoeff_ptr + lVar43 + 4) = (undefined1  [16])0x0;
        *(undefined1 (*) [16])(dqcoeff_ptr + lVar43) = (undefined1  [16])0x0;
      }
      else {
        auVar129._0_4_ = iVar46 + uVar167;
        auVar129._4_4_ = iVar102 + uVar168;
        auVar129._8_4_ = iVar108 + uVar167;
        auVar129._12_4_ = iVar109 + uVar168;
        uVar32 = CONCAT44(auVar89._8_4_,auVar89._8_4_);
        uVar33 = CONCAT44(auVar89._12_4_,auVar89._12_4_);
        auVar67._0_4_ =
             (int)(((ulong)auVar129._0_4_ * (ulong)uVar161 ^ uVar39) - uVar39 >> 0x10) +
             auVar129._0_4_;
        auVar67._4_4_ =
             (int)(((ulong)auVar129._4_4_ * (ulong)uVar166 ^ uVar32) - uVar32 >> 0x10) +
             auVar129._4_4_;
        auVar67._8_4_ =
             (int)(((auVar129._8_8_ & 0xffffffff) * (ulong)uVar143 ^ uVar42) - uVar42 >> 0x10) +
             auVar129._8_4_;
        auVar67._12_4_ =
             (int)(((auVar129._8_8_ >> 0x20) * (ulong)uVar169 ^ uVar33) - uVar33 >> 0x10) +
             auVar129._12_4_;
        uVar30 = CONCAT44(auVar91._8_4_,auVar91._8_4_);
        uVar31 = CONCAT44(auVar91._12_4_,auVar91._12_4_);
        uVar28 = CONCAT44(auVar91._8_4_,auVar91._8_4_);
        uVar29 = CONCAT44(auVar91._12_4_,auVar91._12_4_);
        auVar165._0_4_ = iVar110 + uVar167;
        auVar165._4_4_ = iVar155 + uVar168;
        auVar165._8_4_ = iVar158 + uVar167;
        auVar165._12_4_ = iVar159 + uVar168;
        auVar68._0_4_ =
             (int)(((ulong)auVar165._0_4_ * (ulong)uVar161 ^ uVar39) - uVar39 >> 0x10) +
             auVar165._0_4_;
        auVar68._4_4_ =
             (int)(((ulong)auVar165._4_4_ * (ulong)uVar166 ^ uVar32) - uVar32 >> 0x10) +
             auVar165._4_4_;
        auVar68._8_4_ =
             (int)(((auVar165._8_8_ & 0xffffffff) * (ulong)uVar143 ^ uVar42) - uVar42 >> 0x10) +
             auVar165._8_4_;
        auVar68._12_4_ =
             (int)(((auVar165._8_8_ >> 0x20) * (ulong)uVar169 ^ uVar33) - uVar33 >> 0x10) +
             auVar165._12_4_;
        auVar99._0_4_ =
             ((uint)(((ulong)auVar67._0_4_ * (ulong)uVar111 ^ uVar30) - uVar30 >> 0xe) ^ uVar137) -
             uVar137;
        auVar99._4_4_ =
             ((uint)((((ulong)auVar67._4_4_ * (ulong)uVar125 ^ uVar28) - uVar28) * 0x40000 >> 0x20)
             ^ uVar142) - uVar142;
        auVar99._8_4_ =
             ((uint)(((auVar67._8_8_ & 0xffffffff) * (ulong)uVar126 ^ uVar31) - uVar31 >> 0xe) ^
             uVar144) - uVar144;
        auVar99._12_4_ =
             ((uint)((((auVar67._8_8_ >> 0x20) * (ulong)uVar127 ^ uVar29) - uVar29) * 0x40000 >>
                    0x20) ^ uVar146) - uVar146;
        auVar130._0_4_ =
             ((uint)(((ulong)auVar68._0_4_ * (ulong)uVar111 ^ uVar30) - uVar30 >> 0xe) ^ uVar145) -
             uVar145;
        auVar130._4_4_ =
             ((uint)((((ulong)auVar68._4_4_ * (ulong)uVar125 ^ uVar28) - uVar28) * 0x40000 >> 0x20)
             ^ uVar134) - uVar134;
        auVar130._8_4_ =
             ((uint)(((auVar68._8_8_ & 0xffffffff) * (ulong)uVar126 ^ uVar31) - uVar31 >> 0xe) ^
             uVar135) - uVar135;
        auVar130._12_4_ =
             ((uint)((((auVar68._8_8_ >> 0x20) * (ulong)uVar127 ^ uVar29) - uVar29) * 0x40000 >>
                    0x20) ^ uVar136) - uVar136;
        auVar121 = auVar121 & auVar99;
        auVar83 = auVar83 & auVar130;
        *(undefined1 (*) [16])(qcoeff_ptr + lVar43) = auVar121;
        *(undefined1 (*) [16])(qcoeff_ptr + lVar43 + 4) = auVar83;
        auVar100._0_4_ = auVar121._0_4_ >> 0x1f;
        auVar100._4_4_ = auVar121._4_4_ >> 0x1f;
        auVar100._8_4_ = auVar121._8_4_ >> 0x1f;
        auVar100._12_4_ = auVar121._12_4_ >> 0x1f;
        auVar121 = auVar121 ^ auVar100;
        auVar122._0_4_ = auVar121._0_4_ - auVar100._0_4_;
        auVar122._4_4_ = auVar121._4_4_ - auVar100._4_4_;
        auVar122._8_4_ = auVar121._8_4_ - auVar100._8_4_;
        auVar122._12_4_ = auVar121._12_4_ - auVar100._12_4_;
        uVar30 = CONCAT44(auVar62._8_4_,auVar62._8_4_);
        uVar31 = CONCAT44(auVar62._12_4_,auVar62._12_4_);
        uVar28 = CONCAT44(auVar62._8_4_,auVar62._8_4_);
        uVar29 = CONCAT44(auVar62._12_4_,auVar62._12_4_);
        auVar70._0_4_ = (undefined4)(((ulong)auVar122._0_4_ * (ulong)uVar78 ^ uVar30) - uVar30 >> 2)
        ;
        auVar69._8_4_ =
             (undefined4)(((auVar122._8_8_ & 0xffffffff) * (ulong)uVar86 ^ uVar31) - uVar31 >> 2);
        auVar69._4_4_ = auVar69._8_4_;
        auVar69._0_4_ = auVar70._0_4_;
        auVar69._12_4_ =
             (int)((((auVar122._8_8_ >> 0x20) * (ulong)uVar87 ^ uVar29) - uVar29) * 0x40000000 >>
                  0x20);
        auVar70._8_8_ = auVar69._8_8_;
        auVar70._4_4_ =
             (int)((((ulong)auVar122._4_4_ * (ulong)uVar85 ^ uVar28) - uVar28) * 0x40000000 >> 0x20)
        ;
        auVar70 = auVar70 ^ auVar100;
        auVar101._0_4_ = auVar83._0_4_ >> 0x1f;
        auVar101._4_4_ = auVar83._4_4_ >> 0x1f;
        auVar101._8_4_ = auVar83._8_4_ >> 0x1f;
        auVar101._12_4_ = auVar83._12_4_ >> 0x1f;
        auVar83 = auVar83 ^ auVar101;
        auVar84._0_4_ = auVar83._0_4_ - auVar101._0_4_;
        auVar84._4_4_ = auVar83._4_4_ - auVar101._4_4_;
        auVar84._8_4_ = auVar83._8_4_ - auVar101._8_4_;
        auVar84._12_4_ = auVar83._12_4_ - auVar101._12_4_;
        auVar124._0_4_ = (undefined4)(((ulong)auVar84._0_4_ * (ulong)uVar78 ^ uVar30) - uVar30 >> 2)
        ;
        auVar123._8_4_ =
             (undefined4)(((auVar84._8_8_ & 0xffffffff) * (ulong)uVar86 ^ uVar31) - uVar31 >> 2);
        auVar123._4_4_ = auVar123._8_4_;
        auVar123._0_4_ = auVar124._0_4_;
        auVar123._12_4_ =
             (int)((((auVar84._8_8_ >> 0x20) * (ulong)uVar87 ^ uVar29) - uVar29) * 0x40000000 >>
                  0x20);
        auVar124._8_8_ = auVar123._8_8_;
        auVar124._4_4_ =
             (int)((((ulong)auVar84._4_4_ * (ulong)uVar85 ^ uVar28) - uVar28) * 0x40000000 >> 0x20);
        auVar124 = auVar124 ^ auVar101;
        piVar2 = dqcoeff_ptr + lVar43;
        *piVar2 = auVar70._0_4_ - auVar100._0_4_;
        piVar2[1] = auVar70._4_4_ - auVar100._4_4_;
        piVar2[2] = auVar70._8_4_ - auVar100._8_4_;
        piVar2[3] = auVar70._12_4_ - auVar100._12_4_;
        piVar2 = dqcoeff_ptr + lVar43 + 4;
        *piVar2 = auVar124._0_4_ - auVar101._0_4_;
        piVar2[1] = auVar124._4_4_ - auVar101._4_4_;
        piVar2[2] = auVar124._8_4_ - auVar101._8_4_;
        piVar2[3] = auVar124._12_4_ - auVar101._12_4_;
      }
      sVar4 = auVar75._0_2_;
      sVar5 = auVar75._2_2_;
      sVar6 = auVar75._4_2_;
      sVar7 = auVar75._6_2_;
      sVar8 = auVar75._8_2_;
      sVar9 = auVar75._10_2_;
      sVar10 = auVar75._12_2_;
      sVar11 = auVar75._14_2_;
      local_148._2_2_ =
           (ushort)((short)local_148._2_2_ < sVar5) * sVar5 |
           (ushort)((short)local_148._2_2_ >= sVar5) * local_148._2_2_;
      local_148._0_2_ =
           (ushort)((short)local_148._0_2_ < sVar4) * sVar4 |
           (ushort)((short)local_148._0_2_ >= sVar4) * local_148._0_2_;
      local_148._4_2_ =
           (ushort)((short)local_148._4_2_ < sVar6) * sVar6 |
           (ushort)((short)local_148._4_2_ >= sVar6) * local_148._4_2_;
      local_148._6_2_ =
           (ushort)((short)local_148._6_2_ < sVar7) * sVar7 |
           (ushort)((short)local_148._6_2_ >= sVar7) * local_148._6_2_;
      local_148._8_2_ =
           (ushort)((short)local_148._8_2_ < sVar8) * sVar8 |
           (ushort)((short)local_148._8_2_ >= sVar8) * local_148._8_2_;
      local_148._10_2_ =
           (ushort)((short)local_148._10_2_ < sVar9) * sVar9 |
           (ushort)((short)local_148._10_2_ >= sVar9) * local_148._10_2_;
      local_148._12_2_ =
           (ushort)((short)local_148._12_2_ < sVar10) * sVar10 |
           (ushort)((short)local_148._12_2_ >= sVar10) * local_148._12_2_;
      local_148._14_2_ =
           (ushort)((short)local_148._14_2_ < sVar11) * sVar11 |
           (ushort)((short)local_148._14_2_ >= sVar11) * local_148._14_2_;
      sVar4 = auVar47._0_2_;
      uVar45 = (ushort)((short)uVar45 < sVar4) * sVar4 | ((short)uVar45 >= sVar4) * uVar45;
      sVar4 = auVar47._2_2_;
      uVar48 = (ushort)((short)uVar48 < sVar4) * sVar4 | ((short)uVar48 >= sVar4) * uVar48;
      sVar4 = auVar47._4_2_;
      uVar49 = (ushort)((short)uVar49 < sVar4) * sVar4 | ((short)uVar49 >= sVar4) * uVar49;
      sVar4 = auVar47._6_2_;
      uVar51 = (ushort)((short)uVar51 < sVar4) * sVar4 | ((short)uVar51 >= sVar4) * uVar51;
      sVar4 = auVar47._8_2_;
      uVar52 = (ushort)((short)uVar52 < sVar4) * sVar4 | ((short)uVar52 >= sVar4) * uVar52;
      sVar4 = auVar47._10_2_;
      uVar53 = (ushort)((short)uVar53 < sVar4) * sVar4 | ((short)uVar53 >= sVar4) * uVar53;
      sVar4 = auVar47._12_2_;
      uVar54 = (ushort)((short)uVar54 < sVar4) * sVar4 | ((short)uVar54 >= sVar4) * uVar54;
      sVar4 = auVar47._14_2_;
      uVar55 = (ushort)((short)uVar55 < sVar4) * sVar4 | ((short)uVar55 >= sVar4) * uVar55;
      lVar43 = lVar43 + 8;
    } while (lVar43 < n_coeffs);
  }
  if (bVar44) {
    uVar56 = (ushort)((short)local_148._8_2_ < (short)local_148._0_2_) * local_148._0_2_ |
             (ushort)((short)local_148._8_2_ >= (short)local_148._0_2_) * local_148._8_2_;
    uVar71 = (ushort)((short)local_148._10_2_ < (short)local_148._2_2_) * local_148._2_2_ |
             (ushort)((short)local_148._10_2_ >= (short)local_148._2_2_) * local_148._10_2_;
    uVar72 = (ushort)((short)local_148._12_2_ < (short)local_148._4_2_) * local_148._4_2_ |
             (ushort)((short)local_148._12_2_ >= (short)local_148._4_2_) * local_148._12_2_;
    uVar73 = (ushort)((short)local_148._14_2_ < (short)local_148._6_2_) * local_148._6_2_ |
             (ushort)((short)local_148._14_2_ >= (short)local_148._6_2_) * local_148._14_2_;
    uVar56 = ((short)uVar72 < (short)uVar56) * uVar56 | ((short)uVar72 >= (short)uVar56) * uVar72;
    uVar71 = ((short)uVar73 < (short)uVar71) * uVar71 | ((short)uVar73 >= (short)uVar71) * uVar73;
    uVar78 = (ushort)(((short)uVar71 < (short)uVar56) * uVar56 |
                     ((short)uVar71 >= (short)uVar56) * uVar71) + 1;
  }
  else {
    uVar78 = 0;
  }
  if (bVar12) {
    uVar52 = ((short)uVar52 < (short)uVar45) * uVar45 | ((short)uVar52 >= (short)uVar45) * uVar52;
    uVar53 = ((short)uVar53 < (short)uVar48) * uVar48 | ((short)uVar53 >= (short)uVar48) * uVar53;
    uVar48 = ((short)uVar54 < (short)uVar49) * uVar49 | ((short)uVar54 >= (short)uVar49) * uVar54;
    uVar49 = ((short)uVar55 < (short)uVar51) * uVar51 | ((short)uVar55 >= (short)uVar51) * uVar55;
    uVar48 = ((short)uVar48 < (short)uVar52) * uVar52 | ((short)uVar48 >= (short)uVar52) * uVar48;
    uVar49 = ((short)uVar49 < (short)uVar53) * uVar53 | ((short)uVar49 >= (short)uVar53) * uVar49;
    uVar85 = (uint)(ushort)(((short)uVar49 < (short)uVar48) * uVar48 |
                           ((short)uVar49 >= (short)uVar48) * uVar49);
  }
  else {
    uVar85 = 0xffffffff;
  }
  if ((int)uVar78 <= (int)uVar85) {
    iVar46 = uVar85 + 1;
    psVar41 = scan + uVar85;
    do {
      sVar4 = *psVar41;
      qcoeff_ptr[sVar4] = 0;
      dqcoeff_ptr[sVar4] = 0;
      iVar46 = iVar46 + -1;
      psVar41 = psVar41 + -1;
    } while ((int)uVar78 < iVar46);
  }
  uVar42 = 0xffffffff;
  uVar39 = (ulong)uVar78;
  do {
    iVar46 = (int)uVar42;
    if ((long)uVar39 < 1) break;
    lVar43 = uVar39 - 1;
    uVar39 = uVar39 - 1;
    if (qcoeff_ptr[scan[lVar43]] != 0) {
      uVar42 = uVar39 & 0xffffffff;
    }
    iVar46 = (int)uVar42;
  } while (qcoeff_ptr[scan[lVar43]] == 0);
  uVar40 = (uint16_t)(iVar46 + 1U);
  *eob_ptr = uVar40;
  if (uVar78 == 0) {
    uVar85 = 0xffffffff;
  }
  else {
    lVar43 = 0;
    do {
      uVar85 = (uint)lVar43;
      if (qcoeff_ptr[scan[lVar43]] != 0) break;
      bVar44 = (ulong)uVar78 - 1 != lVar43;
      lVar43 = lVar43 + 1;
      uVar85 = 0xffffffff;
    } while (bVar44);
  }
  if ((uVar40 != 0) && (uVar78 = (iVar46 + 1U & 0xffff) - 1, uVar85 == uVar78)) {
    sVar4 = scan[uVar78];
    if (((qcoeff_ptr[sVar4] == 1) || (qcoeff_ptr[sVar4] == -1)) &&
       (uVar78 = coeff_ptr[sVar4] >> 0x1f,
       (int)((coeff_ptr[sVar4] << 5 ^ uVar78) - uVar78) <
       *(int *)((long)local_110 + (ulong)(sVar4 != 0) * 4) * 0x20 +
       (dequant_ptr[sVar4 != 0] * 0x20d + 0x40 >> 7))) {
      qcoeff_ptr[sVar4] = 0;
      dqcoeff_ptr[sVar4] = 0;
      *eob_ptr = 0;
    }
  }
  return;
}

Assistant:

void aom_highbd_quantize_b_64x64_adaptive_sse2(
    const tran_low_t *coeff_ptr, intptr_t n_coeffs, const int16_t *zbin_ptr,
    const int16_t *round_ptr, const int16_t *quant_ptr,
    const int16_t *quant_shift_ptr, tran_low_t *qcoeff_ptr,
    tran_low_t *dqcoeff_ptr, const int16_t *dequant_ptr, uint16_t *eob_ptr,
    const int16_t *scan, const int16_t *iscan) {
  int index = 8;
  const int log_scale = 2;
  int non_zero_count = 0;
  int non_zero_count_prescan_add_zero = 0;
  int is_found0 = 0, is_found1 = 0;
  int eob = -1;
  const __m128i zero = _mm_setzero_si128();
  const __m128i one = _mm_set1_epi32(1);
  const __m128i log_scale_vec = _mm_set1_epi32(log_scale);
  __m128i zbin, round, quant, dequant, shift;
  __m128i coeff0, coeff1, coeff0_sign, coeff1_sign;
  __m128i qcoeff0, qcoeff1;
  __m128i cmp_mask0, cmp_mask1, cmp_mask;
  __m128i all_zero;
  __m128i mask0 = zero, mask1 = zero;

  const int zbins[2] = { ROUND_POWER_OF_TWO(zbin_ptr[0], log_scale),
                         ROUND_POWER_OF_TWO(zbin_ptr[1], log_scale) };
  int prescan_add[2];
  int thresh[4];
  const qm_val_t wt = (1 << AOM_QM_BITS);
  for (int i = 0; i < 2; ++i) {
    prescan_add[i] = ROUND_POWER_OF_TWO(dequant_ptr[i] * EOB_FACTOR, 7);
    thresh[i] = (zbins[i] * wt + prescan_add[i]) - 1;
  }
  thresh[2] = thresh[3] = thresh[1];
  __m128i threshold[2];
  threshold[0] = _mm_loadu_si128((__m128i *)&thresh[0]);
  threshold[1] = _mm_unpackhi_epi64(threshold[0], threshold[0]);

#if SKIP_EOB_FACTOR_ADJUST
  int first = -1;
#endif
  // Setup global values.
  zbin = _mm_load_si128((const __m128i *)zbin_ptr);
  round = _mm_load_si128((const __m128i *)round_ptr);
  quant = _mm_load_si128((const __m128i *)quant_ptr);
  dequant = _mm_load_si128((const __m128i *)dequant_ptr);
  shift = _mm_load_si128((const __m128i *)quant_shift_ptr);

  __m128i zbin_sign = _mm_srai_epi16(zbin, 15);
  __m128i round_sign = _mm_srai_epi16(round, 15);
  __m128i quant_sign = _mm_srai_epi16(quant, 15);
  __m128i dequant_sign = _mm_srai_epi16(dequant, 15);
  __m128i shift_sign = _mm_srai_epi16(shift, 15);

  zbin = _mm_unpacklo_epi16(zbin, zbin_sign);
  round = _mm_unpacklo_epi16(round, round_sign);
  quant = _mm_unpacklo_epi16(quant, quant_sign);
  dequant = _mm_unpacklo_epi16(dequant, dequant_sign);
  shift = _mm_unpacklo_epi16(shift, shift_sign);

  // Shift with rounding.
  zbin = _mm_add_epi32(zbin, log_scale_vec);
  round = _mm_add_epi32(round, log_scale_vec);
  zbin = _mm_srli_epi32(zbin, log_scale);
  round = _mm_srli_epi32(round, log_scale);
  zbin = _mm_sub_epi32(zbin, one);

  // Do DC and first 15 AC.
  coeff0 = _mm_load_si128((__m128i *)(coeff_ptr));
  coeff1 = _mm_load_si128((__m128i *)(coeff_ptr + 4));

  coeff0_sign = _mm_srai_epi32(coeff0, 31);
  coeff1_sign = _mm_srai_epi32(coeff1, 31);
  qcoeff0 = invert_sign_32_sse2(coeff0, coeff0_sign);
  qcoeff1 = invert_sign_32_sse2(coeff1, coeff1_sign);

  highbd_update_mask0(&qcoeff0, &qcoeff1, threshold, iscan, &is_found0, &mask0);

  cmp_mask0 = _mm_cmpgt_epi32(qcoeff0, zbin);
  zbin = _mm_unpackhi_epi64(zbin, zbin);  // Switch DC to AC
  cmp_mask1 = _mm_cmpgt_epi32(qcoeff1, zbin);
  cmp_mask = _mm_packs_epi32(cmp_mask0, cmp_mask1);
  highbd_update_mask1(&cmp_mask, iscan, &is_found1, &mask1);

  threshold[0] = threshold[1];
  all_zero = _mm_or_si128(cmp_mask0, cmp_mask1);
  if (_mm_movemask_epi8(all_zero) == 0) {
    _mm_store_si128((__m128i *)(qcoeff_ptr), zero);
    _mm_store_si128((__m128i *)(qcoeff_ptr + 4), zero);
    _mm_store_si128((__m128i *)(dqcoeff_ptr), zero);
    _mm_store_si128((__m128i *)(dqcoeff_ptr + 4), zero);

    round = _mm_unpackhi_epi64(round, round);
    quant = _mm_unpackhi_epi64(quant, quant);
    shift = _mm_unpackhi_epi64(shift, shift);
    dequant = _mm_unpackhi_epi64(dequant, dequant);
  } else {
    highbd_calculate_qcoeff(&qcoeff0, &round, &quant, &shift, &log_scale);

    round = _mm_unpackhi_epi64(round, round);
    quant = _mm_unpackhi_epi64(quant, quant);
    shift = _mm_unpackhi_epi64(shift, shift);
    highbd_calculate_qcoeff(&qcoeff1, &round, &quant, &shift, &log_scale);

    // Reinsert signs
    qcoeff0 = invert_sign_32_sse2(qcoeff0, coeff0_sign);
    qcoeff1 = invert_sign_32_sse2(qcoeff1, coeff1_sign);

    // Mask out zbin threshold coeffs
    qcoeff0 = _mm_and_si128(qcoeff0, cmp_mask0);
    qcoeff1 = _mm_and_si128(qcoeff1, cmp_mask1);

    _mm_store_si128((__m128i *)(qcoeff_ptr), qcoeff0);
    _mm_store_si128((__m128i *)(qcoeff_ptr + 4), qcoeff1);

    coeff0 = highbd_calculate_dqcoeff(qcoeff0, dequant, log_scale);
    dequant = _mm_unpackhi_epi64(dequant, dequant);
    coeff1 = highbd_calculate_dqcoeff(qcoeff1, dequant, log_scale);
    _mm_store_si128((__m128i *)(dqcoeff_ptr), coeff0);
    _mm_store_si128((__m128i *)(dqcoeff_ptr + 4), coeff1);
  }

  // AC only loop.
  while (index < n_coeffs) {
    coeff0 = _mm_load_si128((__m128i *)(coeff_ptr + index));
    coeff1 = _mm_load_si128((__m128i *)(coeff_ptr + index + 4));

    coeff0_sign = _mm_srai_epi32(coeff0, 31);
    coeff1_sign = _mm_srai_epi32(coeff1, 31);
    qcoeff0 = invert_sign_32_sse2(coeff0, coeff0_sign);
    qcoeff1 = invert_sign_32_sse2(coeff1, coeff1_sign);

    highbd_update_mask0(&qcoeff0, &qcoeff1, threshold, iscan + index,
                        &is_found0, &mask0);

    cmp_mask0 = _mm_cmpgt_epi32(qcoeff0, zbin);
    cmp_mask1 = _mm_cmpgt_epi32(qcoeff1, zbin);
    cmp_mask = _mm_packs_epi32(cmp_mask0, cmp_mask1);
    highbd_update_mask1(&cmp_mask, iscan + index, &is_found1, &mask1);

    all_zero = _mm_or_si128(cmp_mask0, cmp_mask1);
    if (_mm_movemask_epi8(all_zero) == 0) {
      _mm_store_si128((__m128i *)(qcoeff_ptr + index), zero);
      _mm_store_si128((__m128i *)(qcoeff_ptr + index + 4), zero);
      _mm_store_si128((__m128i *)(dqcoeff_ptr + index), zero);
      _mm_store_si128((__m128i *)(dqcoeff_ptr + index + 4), zero);
      index += 8;
      continue;
    }
    highbd_calculate_qcoeff(&qcoeff0, &round, &quant, &shift, &log_scale);
    highbd_calculate_qcoeff(&qcoeff1, &round, &quant, &shift, &log_scale);

    qcoeff0 = invert_sign_32_sse2(qcoeff0, coeff0_sign);
    qcoeff1 = invert_sign_32_sse2(qcoeff1, coeff1_sign);

    qcoeff0 = _mm_and_si128(qcoeff0, cmp_mask0);
    qcoeff1 = _mm_and_si128(qcoeff1, cmp_mask1);

    _mm_store_si128((__m128i *)(qcoeff_ptr + index), qcoeff0);
    _mm_store_si128((__m128i *)(qcoeff_ptr + index + 4), qcoeff1);

    coeff0 = highbd_calculate_dqcoeff(qcoeff0, dequant, log_scale);
    coeff1 = highbd_calculate_dqcoeff(qcoeff1, dequant, log_scale);

    _mm_store_si128((__m128i *)(dqcoeff_ptr + index), coeff0);
    _mm_store_si128((__m128i *)(dqcoeff_ptr + index + 4), coeff1);

    index += 8;
  }
  if (is_found0) non_zero_count = calculate_non_zero_count(mask0);
  if (is_found1)
    non_zero_count_prescan_add_zero = calculate_non_zero_count(mask1);

  for (int i = non_zero_count_prescan_add_zero - 1; i >= non_zero_count; i--) {
    const int rc = scan[i];
    qcoeff_ptr[rc] = 0;
    dqcoeff_ptr[rc] = 0;
  }

  for (int i = non_zero_count - 1; i >= 0; i--) {
    const int rc = scan[i];
    if (qcoeff_ptr[rc]) {
      eob = i;
      break;
    }
  }

  *eob_ptr = eob + 1;
#if SKIP_EOB_FACTOR_ADJUST
  // TODO(Aniket): Experiment the following loop with intrinsic by combining
  // with the quantization loop above
  for (int i = 0; i < non_zero_count; i++) {
    const int rc = scan[i];
    const int qcoeff = qcoeff_ptr[rc];
    if (qcoeff) {
      first = i;
      break;
    }
  }
  if ((*eob_ptr - 1) >= 0 && first == (*eob_ptr - 1)) {
    const int rc = scan[(*eob_ptr - 1)];
    if (qcoeff_ptr[rc] == 1 || qcoeff_ptr[rc] == -1) {
      const int coeff = coeff_ptr[rc] * wt;
      const int coeff_sign = AOMSIGN(coeff);
      const int abs_coeff = (coeff ^ coeff_sign) - coeff_sign;
      const int factor = EOB_FACTOR + SKIP_EOB_FACTOR_ADJUST;
      const int prescan_add_val =
          ROUND_POWER_OF_TWO(dequant_ptr[rc != 0] * factor, 7);
      if (abs_coeff < (zbins[rc != 0] * (1 << AOM_QM_BITS) + prescan_add_val)) {
        qcoeff_ptr[rc] = 0;
        dqcoeff_ptr[rc] = 0;
        *eob_ptr = 0;
      }
    }
  }
#endif
}